

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constrain.cpp
# Opt level: O0

void __thiscall CaDiCaL::Internal::constrain(Internal *this,int lit)

{
  bool bVar1;
  char cVar2;
  reference piVar3;
  reference piVar4;
  iterator this_00;
  iterator iVar5;
  int in_ESI;
  Internal *in_RDI;
  int lit_2;
  iterator __end4;
  iterator __begin4;
  vector<int,_std::allocator<int>_> *__range4;
  int *lit_1;
  iterator __end2;
  iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  int tmp;
  const_iterator j;
  iterator i;
  const_iterator end;
  bool satisfied_constraint;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff58;
  vector<int,_std::allocator<int>_> *this_01;
  undefined4 in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  size_type in_stack_ffffffffffffff78;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff98;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffffa0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_40;
  int local_34;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_30;
  int *local_28;
  int *local_20;
  byte local_d;
  
  if (in_ESI == 0) {
    if (in_RDI->level != 0) {
      backtrack((Internal *)in_stack_ffffffffffffffa0._M_current,
                (int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    }
    local_d = 0;
    local_20 = (int *)std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff58);
    __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
    __normal_iterator<int*>
              ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
               CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
               in_stack_ffffffffffffff58);
    local_28 = (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff58);
    __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
    __normal_iterator<int*>
              ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
               CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
               in_stack_ffffffffffffff58);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                               *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                              (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                               *)in_stack_ffffffffffffff58), bVar1) {
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                (&local_30);
      cVar2 = marked((Internal *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                     (int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
      local_34 = (int)cVar2;
      if (local_34 < 1) {
        if (local_34 < 0) {
          local_d = 1;
          break;
        }
        piVar3 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                 ::operator*(&local_30);
        cVar2 = val(in_RDI,*piVar3);
        local_34 = (int)cVar2;
        if (-1 < local_34) {
          if (0 < local_34) {
            local_d = 1;
            break;
          }
          piVar3 = __gnu_cxx::
                   __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&local_30);
          in_stack_ffffffffffffff64 = *piVar3;
          local_40 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator++((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *
                                )in_RDI,in_stack_ffffffffffffff64);
          piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&local_40);
          *piVar4 = in_stack_ffffffffffffff64;
          __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
          operator*(&local_30);
          mark((Internal *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               (int)((ulong)in_RDI >> 0x20));
        }
      }
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)in_RDI,
                 in_stack_ffffffffffffff64);
    }
    this_01 = &in_RDI->constraint;
    std::vector<int,_std::allocator<int>_>::begin(this_01);
    __gnu_cxx::operator-
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
               CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)this_01);
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff80._M_current,
               in_stack_ffffffffffffff78);
    std::vector<int,_std::allocator<int>_>::begin(this_01);
    std::vector<int,_std::allocator<int>_>::end(this_01);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                              (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              this_01), bVar1) {
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                 &stack0xffffffffffffffa0);
      unmark((Internal *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             (int)((ulong)this_01 >> 0x20));
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                 &stack0xffffffffffffffa0);
    }
    if ((local_d & 1) == 0) {
      bVar1 = std::vector<int,_std::allocator<int>_>::empty
                        ((vector<int,_std::allocator<int>_> *)
                         CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      if (bVar1) {
        in_RDI->unsat_constraint = true;
        if (in_RDI->conflict_id == 0) {
          in_RDI->marked_failed = false;
        }
      }
      else {
        this_00 = std::vector<int,_std::allocator<int>_>::begin(this_01);
        iVar5 = std::vector<int,_std::allocator<int>_>::end(this_01);
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                   *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                                  (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                   *)this_01), bVar1) {
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                    ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     &stack0xffffffffffffff80);
          freeze((Internal *)this_00._M_current,(int)((ulong)iVar5._M_current >> 0x20));
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     &stack0xffffffffffffff80);
        }
      }
    }
    else {
      std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0xd80e8c);
    }
  }
  else {
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),&in_RDI->mode);
  }
  return;
}

Assistant:

void Internal::constrain (int lit) {
  if (lit)
    constraint.push_back (lit);
  else {
    if (level)
      backtrack ();
    LOG (constraint, "shrinking constraint");
    bool satisfied_constraint = false;
    const vector<int>::const_iterator end = constraint.end ();
    vector<int>::iterator i = constraint.begin ();
    for (vector<int>::const_iterator j = i; j != end; j++) {
      int tmp = marked (*j);
      if (tmp > 0) {
        LOG ("removing duplicated literal %d from constraint", *j);
      } else if (tmp < 0) {
        LOG ("tautological since both %d and %d occur in constraint", -*j,
             *j);
        satisfied_constraint = true;
        break;
      } else {
        tmp = val (*j);
        if (tmp < 0) {
          LOG ("removing falsified literal %d from constraint clause", *j);
        } else if (tmp > 0) {
          LOG ("satisfied constraint with literal %d", *j);
          satisfied_constraint = true;
          break;
        } else {
          *i++ = *j;
          mark (*j);
        }
      }
    }
    constraint.resize (i - constraint.begin ());
    for (const auto &lit : constraint)
      unmark (lit);
    if (satisfied_constraint)
      constraint.clear ();
    else if (constraint.empty ()) {
      unsat_constraint = true;
      if (!conflict_id)
        marked_failed = false; // allow to trigger failing ()
    } else
      for (const auto lit : constraint)
        freeze (lit);
  }
}